

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_filter_program.c
# Opt level: O0

ssize_t program_filter_read(archive_read_filter *self,void **buff)

{
  void *pvVar1;
  ssize_t sVar2;
  bool bVar3;
  char *local_40;
  char *p;
  size_t total;
  ssize_t bytes;
  program_filter *state;
  void **buff_local;
  archive_read_filter *self_local;
  
  pvVar1 = self->data;
  p = (char *)0x0;
  local_40 = *(char **)((long)pvVar1 + 0x30);
  while( true ) {
    bVar3 = false;
    if (*(int *)((long)pvVar1 + 0x28) != -1) {
      bVar3 = p < *(char **)((long)pvVar1 + 0x38);
    }
    if (!bVar3) break;
    sVar2 = child_read(self,local_40,*(long *)((long)pvVar1 + 0x38) - (long)p);
    if (sVar2 < 0) {
      return -0x1e;
    }
    if (sVar2 == 0) break;
    p = p + sVar2;
    local_40 = local_40 + sVar2;
  }
  *buff = *(void **)((long)pvVar1 + 0x30);
  return (ssize_t)p;
}

Assistant:

static ssize_t
program_filter_read(struct archive_read_filter *self, const void **buff)
{
	struct program_filter *state;
	ssize_t bytes;
	size_t total;
	char *p;

	state = (struct program_filter *)self->data;

	total = 0;
	p = state->out_buf;
	while (state->child_stdout != -1 && total < state->out_buf_len) {
		bytes = child_read(self, p, state->out_buf_len - total);
		if (bytes < 0)
			/* No recovery is possible if we can no longer
			 * read from the child. */
			return (ARCHIVE_FATAL);
		if (bytes == 0)
			/* We got EOF from the child. */
			break;
		total += bytes;
		p += bytes;
	}

	*buff = state->out_buf;
	return (total);
}